

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_custom_callback2(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  char *pcVar5;
  long lVar6;
  cargo_t cargo;
  _test_data_t data;
  int b;
  char *args [4];
  char title [256];
  char optname [256];
  char grpname [256];
  int vals [31] [24];
  cargo_t local_f18;
  uint local_f0c;
  uint local_f08;
  int local_f04;
  undefined1 *local_f00;
  undefined4 local_ef8;
  undefined4 uStack_ef4;
  undefined4 uStack_ef0;
  undefined4 uStack_eec;
  char *local_ee8;
  char *pcStack_ee0;
  char local_ed8 [256];
  char local_dd8 [256];
  char local_cd8 [256];
  undefined1 local_bd8 [2984];
  
  iVar1 = cargo_init(&local_f18,0,"program");
  if (iVar1 == 0) {
    local_f04 = 0;
    local_ee8 = "--alpha";
    pcStack_ee0 = "128x64";
    local_ef8 = 0x12ab1a;
    uStack_ef4 = 0;
    uStack_ef0 = 0x12aac3;
    uStack_eec = 0;
    if (local_f18 == (cargo_t)0x0) {
      __assert_fail("ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x127d,"void cargo_set_flags(cargo_t, cargo_flags_t)");
    }
    local_f18->flags = CARGO_AUTOCLEAN;
    iVar1 = cargo_add_option(local_f18,0,"--alpha","The alpha","c",_test_cb,&local_f0c);
    iVar2 = cargo_add_option(local_f18,0,"--beta","The beta","b",&local_f04);
    if (iVar2 == 0 && iVar1 == 0) {
      puVar4 = local_bd8;
      lVar3 = 0;
      do {
        lVar3 = lVar3 + 1;
        cargo_snprintf(local_cd8,0x100,"group%d",lVar3);
        cargo_snprintf(local_ed8,0x100,"The Group%d",lVar3);
        iVar1 = cargo_add_group(local_f18,0,local_cd8,local_ed8,"Group");
        if (iVar1 != 0) {
          pcVar5 = "Failed to add group";
          goto LAB_00117110;
        }
        lVar6 = 1;
        local_f00 = puVar4;
        while (lVar6 != 0x19) {
          cargo_snprintf(local_dd8,0x100,"--optg%02do%02d",lVar3,lVar6);
          iVar1 = cargo_add_option(local_f18,0,local_dd8,
                                   "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
                                   ,"i");
          iVar2 = _cargo_group_add_option_ex
                            (local_f18,local_f18->groups,local_f18->group_count,local_cd8,local_dd8,
                             0);
          lVar6 = lVar6 + 1;
          if (iVar2 != 0 || iVar1 != 0) {
            pcVar5 = "Failed to add option";
            goto LAB_00117110;
          }
        }
        puVar4 = local_f00 + 0x60;
      } while (lVar3 != 0x1f);
      cargo_parse(local_f18,0,1,4,(char **)&local_ef8);
      printf("%dx%d\n",(ulong)local_f0c,(ulong)local_f08);
      pcVar5 = "Width expected to be 128";
      if ((local_f0c == 0x80) && (pcVar5 = "Height expected to be 128", local_f08 == 0x40)) {
        if (local_f04 == 1) {
          cargo_parse(local_f18,0,1,4,(char **)&local_ef8);
          printf("%dx%d\n",(ulong)local_f0c,(ulong)local_f08);
          pcVar5 = "Width expected to be 128";
          if (((local_f0c == 0x80) && (pcVar5 = "Height expected to be 128", local_f08 == 0x40)) &&
             (pcVar5 = (char *)0x0, local_f04 != 1)) {
            pcVar5 = "Expected b == 1";
          }
        }
        else {
          pcVar5 = "Expected b == 1";
        }
      }
    }
    else {
      pcVar5 = "Failed to add options";
    }
LAB_00117110:
    cargo_destroy(&local_f18);
  }
  else {
    pcVar5 = "Failed to init cargo";
  }
  return pcVar5;
}

Assistant:

_TEST_START(TEST_custom_callback2)
{
    _test_data_t data;
    int b = 0;

    #define GROUP_COUNT (CARGO_DEFAULT_MAX_GROUPS * 8 - 1)
    #define GROUP_OPT_COUNT (CARGO_DEFAULT_MAX_GROUP_OPTS * 3)
    int vals[GROUP_COUNT][GROUP_OPT_COUNT];
    char grpname[256];
    char title[256];
    char optname[256];
    size_t i;
    size_t j;
    char *args[] = { "program", "--beta", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    // Add a custom argument
    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);

    ret |= cargo_add_option(cargo, 0, "--beta", "The beta", "b", &b);
    cargo_assert(ret == 0, "Failed to add options");

    // Add many groups. We do this to trigger a reallocation.
    for (i = 0; i < GROUP_COUNT; i++)
    {
        cargo_snprintf(grpname, sizeof(grpname), "group%d", i+1);
        cargo_snprintf(title, sizeof(title), "The Group%d", i+1);
        ret |= cargo_add_group(cargo, 0, grpname, title, "Group");
        cargo_assert(ret == 0, "Failed to add group");

        for (j = 0; j < GROUP_OPT_COUNT; j++)
        {
            cargo_snprintf(optname, sizeof(optname), "--optg%02do%02d", i+1, j+1);
            ret |= cargo_add_option(cargo, 0, optname, LOREM_IPSUM, "i", &vals[i][j]);
            ret |= cargo_group_add_option(cargo, grpname, optname);
            cargo_assert(ret == 0, "Failed to add option");
        }
    }

    cargo_assert(ret == 0, "Failed to add groups");

    // Test to parse twice.
    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");
    cargo_assert(b == 1, "Expected b == 1");

    _TEST_CLEANUP();
}